

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::parse(Reader *this,istream *sin,Value *root)

{
  char *beginDoc;
  bool bVar1;
  string doc;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  local_30 = 0;
  local_28 = 0;
  local_38 = &local_28;
  std::getline<char,std::char_traits<char>,std::allocator<char>>(sin,(string *)&local_38,-1);
  std::__cxx11::string::_M_assign((string *)&this->document_);
  beginDoc = (this->document_)._M_dataplus._M_p;
  bVar1 = parse(this,beginDoc,beginDoc + (this->document_)._M_string_length,root);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return bVar1;
}

Assistant:

bool
Reader::parse ( std::istream& sin,
                Value& root)
{
    //std::istream_iterator<char> begin(sin);
    //std::istream_iterator<char> end;
    // Those would allow streamed input from a file, if parse() were a
    // template function.

    // Since std::string is reference-counted, this at least does not
    // create an extra copy.
    std::string doc;
    std::getline (sin, doc, (char)EOF);
    return parse ( doc, root );
}